

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

int trim_finfo(FINFO **fp)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  FINFO *local_60;
  FINFO *lastp;
  char ver [16];
  int local_40;
  int linkp;
  int pnum;
  int num;
  FINFO *pp;
  FINFO *cp;
  FINFO *mp;
  FINFO *sp;
  FINFO *tp;
  FINFO **fp_local;
  
  mp = *fp;
  _pnum = (FINFO *)0x0;
  local_40 = 0;
  linkp = 0;
  do {
    pp = mp;
    if (mp->dirp == 0) {
      if ((mp->next == (finfo *)0x0) ||
         (iVar1 = strcmp(mp->next->no_ver_name,mp->no_ver_name), iVar1 != 0)) {
        cp = mp;
      }
      else {
        cp = mp->next;
        pp = cp;
        while( true ) {
          linkp = linkp + 1;
          bVar3 = false;
          if (pp->next != (finfo *)0x0) {
            iVar1 = strcmp(pp->next->no_ver_name,pp->no_ver_name);
            bVar3 = iVar1 == 0;
          }
          if (!bVar3) break;
          pp = pp->next;
        }
      }
      if (mp->version == 0) {
        if (pp == mp) {
          strcat(pp->lname,";1");
          pp->lname_len = pp->lname_len + 2;
          mp = pp->next;
          linkp = local_40 + 1;
        }
        else {
          ver[0xc] = '\0';
          ver[0xd] = '\0';
          ver[0xe] = '\0';
          ver[0xf] = '\0';
          sp = mp;
          do {
            sp = sp->next;
            if (sp->ino == mp->ino) {
              ver[0xc] = '\x01';
              ver[0xd] = '\0';
              ver[0xe] = '\0';
              ver[0xf] = '\0';
              break;
            }
          } while (pp != sp);
          if (ver._12_4_ == 0) {
            sprintf((char *)&lastp,";%u",(ulong)(cp->version + 1));
            strcat(mp->lname,(char *)&lastp);
            sVar2 = strlen(mp->lname);
            mp->lname_len = sVar2;
            linkp = linkp + 1;
            mp = pp->next;
          }
          else {
            mp->next = (finfo *)0x0;
            for (local_60 = mp; local_60->next != (finfo *)0x0; local_60 = local_60->next) {
            }
            local_60->next = FreeFinfoList;
            FreeFinfoList = mp;
            if (_pnum == (FINFO *)0x0) {
              *fp = cp;
            }
            else {
              _pnum->next = cp;
            }
            mp = pp->next;
          }
        }
      }
      else {
        if (pp != mp) {
          local_40 = linkp;
        }
        linkp = local_40 + 1;
        mp = pp->next;
      }
      _pnum = pp;
      local_40 = linkp;
    }
    else {
      _pnum = mp;
      mp = mp->next;
      local_40 = local_40 + 1;
      linkp = linkp + 1;
    }
    if (mp == (FINFO *)0x0) {
      return linkp;
    }
  } while( true );
}

Assistant:

static int trim_finfo(FINFO **fp)
{
#ifndef DOS
  FINFO *tp, *sp, *mp, *cp, *pp;
  int num, pnum;
  int linkp;
  char ver[VERSIONLEN];

  sp = mp = cp = *fp;
  pp = (FINFO *)NULL;
  num = pnum = 0;

  do {
    if (cp->dirp) {
      pp = cp;
      sp = cp = cp->next;
      pnum++;
      num++;
      continue;
    }

    if (cp->next != (FINFO *)NULL && strcmp(cp->next->no_ver_name, cp->no_ver_name) == 0) {
      mp = cp = cp->next;
      num++;
      while (cp->next != (FINFO *)NULL && strcmp(cp->next->no_ver_name, cp->no_ver_name) == 0) {
        cp = cp->next;
        num++;
      }
    } else {
      mp = cp;
    }

    if (sp->version == 0) {
      if (cp != sp) {
        /*
         * Both versionless and versioned files exists.
         */
        linkp = 0;
        tp = sp;
        do {
          tp = tp->next;
          if (tp->ino == sp->ino) {
            linkp = 1;
            break;
          }
        } while (cp != tp);

        if (!linkp) {
          /*
           * Versionless is not linked to any versioned
           * file.
           */
          sprintf(ver, ";%u", mp->version + 1);
          strcat(sp->lname, ver);
          sp->lname_len = strlen(sp->lname);
          pnum = ++num;
          pp = cp;
          sp = cp = cp->next;
        } else {
          /*
           * Versionless is linked to one of versionless
           * files. We can remove it.
           */
          sp->next = (FINFO *)NULL;
          FreeFinfo(sp);
          pnum = num;
          if (pp != (FINFO *)NULL)
            pp->next = mp;
          else
            *fp = mp;
          pp = cp;
          sp = cp = cp->next;
        }
      } else {
        /*
         * Only versionless file exists. It is regarded as
         * version 1.
         */
        strcat(cp->lname, ";1");
        cp->lname_len += 2;
        pp = cp;
        sp = cp = cp->next;
        num = ++pnum;
      }
    } else {
      if (cp != sp) {
        /*
         * All files are versioned.
         */
        pnum = ++num;
      } else {
        /*
         * A versioned file only exists.
         */
        num = ++pnum;
      }
      pp = cp;
      sp = cp = cp->next;
    }
  } while (sp != (FINFO *)NULL);

#else  /* DOS version */
  int num = 0;
  FINFO *tp;
  tp = *fp;
  while (tp) {
    num++;
    tp = tp->next;
  }
#endif /* DOS */

  return (num);
}